

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int RunAddRoute(string *remote,Commandline *args)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  initializer_list<bhf::ParameterOption> list;
  allocator local_4bd;
  allocator local_4bc;
  allocator local_4bb;
  allocator local_4ba;
  allocator local_4b9;
  ParameterList params;
  string local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  string local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  string local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  string local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  string local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  ParameterOption local_188 [4];
  ParameterOption local_68;
  
  std::__cxx11::string::string((string *)&local_1a8,"--addr",(allocator *)&local_388);
  std::__cxx11::string::string((string *)&local_1c8,"",(allocator *)&local_3a8);
  bhf::ParameterOption::ParameterOption(local_188,&local_1a8,false,&local_1c8);
  std::__cxx11::string::string((string *)&local_1e8,"--netid",(allocator *)&local_3c8);
  std::__cxx11::string::string((string *)&local_208,"",(allocator *)&local_3e8);
  bhf::ParameterOption::ParameterOption(local_188 + 1,&local_1e8,false,&local_208);
  std::__cxx11::string::string((string *)&local_228,"--password",(allocator *)&local_408);
  std::__cxx11::string::string((string *)&local_248,"",(allocator *)&local_428);
  bhf::ParameterOption::ParameterOption(local_188 + 2,&local_228,false,&local_248);
  std::__cxx11::string::string((string *)&local_268,"--username",(allocator *)&local_448);
  std::__cxx11::string::string((string *)&local_288,"Administrator",(allocator *)&local_468);
  bhf::ParameterOption::ParameterOption(local_188 + 3,&local_268,false,&local_288);
  std::__cxx11::string::string((string *)&local_2a8,"--routename",(allocator *)&local_488);
  std::__cxx11::string::string((string *)&local_2c8,"",&local_4bd);
  bhf::ParameterOption::ParameterOption(&local_68,&local_2a8,false,&local_2c8);
  list._M_len = 5;
  list._M_array = local_188;
  bhf::ParameterList::ParameterList(&params,list);
  lVar3 = 0x120;
  do {
    bhf::ParameterOption::~ParameterOption
              ((ParameterOption *)((long)&local_188[0].key._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x48;
  } while (lVar3 != -0x48);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  bhf::Commandline::Parse((ParameterList *)args);
  std::__cxx11::string::string((string *)&local_388,"--netid",&local_4bd);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  local_2e8._M_string_length = 0;
  local_2e8.field_2._M_local_buf[0] = '\0';
  bhf::ParameterList::Get<std::__cxx11::string>(&local_188[0].key,&params,&local_388,&local_2e8);
  uVar2 = make_AmsNetId((string *)local_188);
  std::__cxx11::string::string((string *)&local_3c8,"--addr",&local_4b9);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  local_308._M_string_length = 0;
  local_308.field_2._M_local_buf[0] = '\0';
  bhf::ParameterList::Get<std::__cxx11::string>(&local_3a8,&params,&local_3c8,&local_308);
  std::__cxx11::string::string((string *)&local_408,"--routename",&local_4ba);
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  local_328._M_string_length = 0;
  local_328.field_2._M_local_buf[0] = '\0';
  bhf::ParameterList::Get<std::__cxx11::string>(&local_3e8,&params,&local_408,&local_328);
  std::__cxx11::string::string((string *)&local_448,"--username",&local_4bb);
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  local_348._M_string_length = 0;
  local_348.field_2._M_local_buf[0] = '\0';
  bhf::ParameterList::Get<std::__cxx11::string>(&local_428,&params,&local_448,&local_348);
  std::__cxx11::string::string((string *)&local_488,"--password",&local_4bc);
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  local_368._M_string_length = 0;
  local_368.field_2._M_local_buf[0] = '\0';
  bhf::ParameterList::Get<std::__cxx11::string>(&local_468,&params,&local_488,&local_368);
  iVar1 = bhf::ads::AddRemoteRoute(remote,uVar2,&local_3a8,&local_3e8,&local_428,&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)local_188);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_388);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>_>
               *)&params);
  return iVar1;
}

Assistant:

int RunAddRoute(const std::string& remote, bhf::Commandline& args)
{
    bhf::ParameterList params = {
        {"--addr"},
        {"--netid"},
        {"--password"},
        {"--username", false, "Administrator"},
        {"--routename"},
    };
    args.Parse(params);

    return bhf::ads::AddRemoteRoute(remote,
                                    make_AmsNetId(params.Get<std::string>("--netid")),
                                    params.Get<std::string>("--addr"),
                                    params.Get<std::string>("--routename"),
                                    params.Get<std::string>("--username"),
                                    params.Get<std::string>("--password")
                                    );
}